

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5FindTokenizer_v2
              (fts5_api *pApi,char *zName,void **ppUserData,fts5_tokenizer_v2 **ppTokenizer)

{
  Fts5TokenizerModule *pFVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Fts5TokenizerModule *pMod;
  int rc;
  char *in_stack_ffffffffffffffc8;
  int local_24;
  
  local_24 = 0;
  pFVar1 = fts5LocateTokenizer((Fts5Global *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffc8);
  if (pFVar1 == (Fts5TokenizerModule *)0x0) {
    *in_RCX = 0;
    *in_RDX = 0;
    local_24 = 1;
  }
  else {
    if (pFVar1->bV2Native == 0) {
      *in_RDX = pFVar1;
    }
    else {
      *in_RDX = pFVar1->pUserData;
    }
    *in_RCX = &pFVar1->x2;
  }
  return local_24;
}

Assistant:

static int fts5FindTokenizer_v2(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of tokenizer */
  void **ppUserData,
  fts5_tokenizer_v2 **ppTokenizer /* Populate this object */
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pMod;

  pMod = fts5LocateTokenizer((Fts5Global*)pApi, zName);
  if( pMod ){
    if( pMod->bV2Native ){
      *ppUserData = pMod->pUserData;
    }else{
      *ppUserData = (void*)pMod;
    }
    *ppTokenizer = &pMod->x2;
  }else{
    *ppTokenizer = 0;
    *ppUserData = 0;
    rc = SQLITE_ERROR;
  }

  return rc;
}